

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  int local_6c;
  size_type *psStack_68;
  int E;
  string turn;
  int local_40;
  int LX;
  int LY;
  int local_34;
  int TX;
  int TY;
  
  piVar4 = (istream *)
           std::istream::operator>>((istream *)&std::cin,(int *)(turn.field_2._M_local_buf + 0xc));
  piVar4 = (istream *)std::istream::operator>>(piVar4,&local_40);
  piVar4 = (istream *)std::istream::operator>>(piVar4,&LY);
  std::istream::operator>>(piVar4,&local_34);
  std::istream::ignore();
  do {
    std::istream::operator>>((istream *)&std::cin,&local_6c);
    std::istream::ignore();
    iVar2 = local_34;
    iVar3 = LY;
    uVar1 = turn.field_2._12_4_;
    turn._M_dataplus._M_p = (pointer)0x0;
    LX = local_40;
    iVar6 = local_40 - local_34;
    psStack_68 = &turn._M_string_length;
    turn._M_string_length._0_1_ = 0;
    if ((iVar6 < 0) || (iVar6 != 0)) {
      std::__cxx11::string::append((char *)&stack0xffffffffffffff98);
    }
    iVar7 = uVar1 - iVar3;
    if ((0 < iVar7) || (iVar7 < 0)) {
      std::__cxx11::string::append((char *)&stack0xffffffffffffff98);
    }
    iVar3 = -(uint)(uVar1 != iVar3);
    if (0 < iVar7) {
      iVar3 = 1;
    }
    LY = LY + iVar3;
    iVar3 = -(uint)(LX != iVar2);
    if (0 < iVar6) {
      iVar3 = 1;
    }
    local_34 = local_34 + iVar3;
    poVar5 = std::operator<<((ostream *)&std::cerr,"dx = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    poVar5 = std::operator<<(poVar5,", dy =");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&stack0xffffffffffffff98);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  } while( true );
}

Assistant:

int main()
{
    int LX; // the X position of the light of power
    int LY; // the Y position of the light of power
    int TX; // Thor's starting X position
    int TY; // Thor's starting Y position
    cin >> LX >> LY >> TX >> TY; cin.ignore();

    // game loop
    while (1)
    {
        int E; // The level of Thor's remaining energy, representing the number of moves he can still make.
        cin >> E;
        cin.ignore();

        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;
        int dx = LX - TX;
        int dy = LY - TY;
        std::string turn;
        if (0 > dy)
        {
            turn += "N";
        } else if (0 < dy)
        {
            turn += "S";
        }
        if (0 < dx)
        {
            turn += "E";
        } else if (0 > dx)
        {
            turn += "W";
        }
        TX += sign(dx);
        TY += sign(dy);
        std::cerr << "dx = " << dx << ", dy =" << dy << std::endl;

        cout << turn << endl; // A single line providing the move to be made: N NE E SE S SW W or NW
    }
}